

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O0

void Saig_ManCexMinDerivePhasePriority
               (Aig_Man_t *pAig,Abc_Cex_t *pCex,Vec_Vec_t *vFrameCis,Vec_Vec_t *vFramePPs,int f,
               Vec_Int_t *vRoots)

{
  int iVar1;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Aig_Obj_t *pAVar2;
  Vec_Int_t *local_78;
  int local_5c;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vLeaves;
  Vec_Int_t *vFrameCisOne;
  Vec_Int_t *vFramePPsOne;
  Vec_Int_t *vRoots_local;
  int f_local;
  Vec_Vec_t *vFramePPs_local;
  Vec_Vec_t *vFrameCis_local;
  Abc_Cex_t *pCex_local;
  Aig_Man_t *pAig_local;
  
  p = Vec_VecEntryInt(vFrameCis,f);
  p_00 = Vec_VecEntryInt(vFramePPs,f);
  local_5c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p);
    if (iVar1 <= local_5c) {
      if (f == pCex->iFrame) {
        local_78 = (Vec_Int_t *)0x0;
      }
      else {
        local_78 = Vec_VecEntryInt(vFrameCis,f + 1);
      }
      Saig_ManCexMinGetCos(pAig,pCex,local_78,vRoots);
      Aig_ManIncrementTravId(pAig);
      for (local_5c = 0; iVar1 = Vec_IntSize(vRoots), local_5c < iVar1; local_5c = local_5c + 1) {
        iVar1 = Vec_IntEntry(vRoots,local_5c);
        pAVar2 = Aig_ManObj(pAig,iVar1);
        Saig_ManCexMinDerivePhasePriority_rec(pAig,pAVar2);
      }
      return;
    }
    iVar1 = Vec_IntEntry(p,local_5c);
    pAVar2 = Aig_ManObj(pAig,iVar1);
    iVar1 = Vec_IntEntry(p_00,local_5c);
    (pAVar2->field_5).iData = iVar1;
    if ((pAVar2->field_5).iData < 0) break;
    local_5c = local_5c + 1;
  }
  __assert_fail("pObj->iData >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                ,0xe2,
                "void Saig_ManCexMinDerivePhasePriority(Aig_Man_t *, Abc_Cex_t *, Vec_Vec_t *, Vec_Vec_t *, int, Vec_Int_t *)"
               );
}

Assistant:

void Saig_ManCexMinDerivePhasePriority( Aig_Man_t * pAig, Abc_Cex_t * pCex, Vec_Vec_t * vFrameCis, Vec_Vec_t * vFramePPs, int f, Vec_Int_t * vRoots )
{
    Vec_Int_t * vFramePPsOne, * vFrameCisOne, * vLeaves;
    Aig_Obj_t * pObj;
    int i;
    // set PP for the CIs
    vFrameCisOne = Vec_VecEntryInt( vFrameCis, f );
    vFramePPsOne = Vec_VecEntryInt( vFramePPs, f );
    Aig_ManForEachObjVec( vFrameCisOne, pAig, pObj, i )
    {
        pObj->iData = Vec_IntEntry( vFramePPsOne, i );
        assert( pObj->iData >= 0 );
    }
//    if ( f == 0 )
//        Saig_ManCexMinVerifyPhase( pAig, pCex, f );

    // create roots
    vLeaves = (f == pCex->iFrame) ? NULL : Vec_VecEntryInt(vFrameCis, f+1);
    Saig_ManCexMinGetCos( pAig, pCex, vLeaves, vRoots );
    // derive for the nodes starting from the roots
    Aig_ManIncrementTravId( pAig );
    Aig_ManForEachObjVec( vRoots, pAig, pObj, i )
    {
        Saig_ManCexMinDerivePhasePriority_rec( pAig, pObj );
//        if ( f == 0 )
//            assert( (pObj->iData & 1) == pObj->fPhase );
    }
}